

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  SourceLineInfo *_lineInfo;
  TestCase *_name;
  IStreamingReporter *pIVar1;
  TestCaseTracker *this_00;
  pointer pUVar2;
  bool _missingAssertions;
  uint uVar3;
  pointer pUVar4;
  StreamRedirect cerrRedir;
  SectionInfo testCaseSection;
  SectionStats testCaseSectionStats;
  allocator local_482;
  allocator local_481;
  double local_480;
  string local_478;
  size_t local_458;
  size_t sStack_450;
  StreamRedirect local_448;
  SectionInfo local_2b8;
  StreamRedirect local_250;
  
  _name = this->m_activeTestCase;
  _lineInfo = &(_name->super_TestCaseInfo).lineInfo;
  SectionInfo::SectionInfo
            (&local_2b8,(string *)_name,&(_name->super_TestCaseInfo).description,_lineInfo);
  pIVar1 = (this->m_reporter).m_p;
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[9])(pIVar1,&local_2b8);
  local_458 = (this->m_totals).assertions.passed;
  sStack_450 = (this->m_totals).assertions.failed;
  std::__cxx11::string::string((string *)&local_448,"TEST_CASE",&local_481);
  std::__cxx11::string::string((string *)&local_478,"",&local_482);
  AssertionInfo::AssertionInfo
            ((AssertionInfo *)&local_250,(string *)&local_448,_lineInfo,&local_478,Normal);
  AssertionInfo::operator=(&this->m_lastAssertionInfo,(AssertionInfo *)&local_250);
  AssertionInfo::~AssertionInfo((AssertionInfo *)&local_250);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_448);
  this_00 = (this->m_testCaseTracker).nullableValue;
  this_00->m_currentSection = &this_00->m_testCase;
  this_00->m_completedASectionThisRun = false;
  if ((this_00->m_testCase).m_runState == NotStarted) {
    (this_00->m_testCase).m_runState = Executing;
  }
  local_478._M_dataplus._M_p = (pointer)anon_unknown_24::getCurrentTicks();
  uVar3 = (*(((this->m_reporter).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
  if ((uVar3 & 1) == 0) {
    (*(((this->m_activeTestCase->test).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])
              ();
  }
  else {
    StreamRedirect::StreamRedirect(&local_250,(ostream *)&std::cout,redirectedCout);
    StreamRedirect::StreamRedirect(&local_448,(ostream *)&std::cerr,redirectedCerr);
    (*(((this->m_activeTestCase->test).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])
              ();
    StreamRedirect::~StreamRedirect(&local_448);
    StreamRedirect::~StreamRedirect(&local_250);
  }
  local_480 = Timer::getElapsedSeconds((Timer *)&local_478);
  SectionTracking::TrackedSection::leave(&this_00->m_testCase);
  pUVar2 = (this->m_unfinishedSections).
           super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pUVar4 = (this->m_unfinishedSections).
                super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
                ._M_impl.super__Vector_impl_data._M_start; pUVar4 != pUVar2; pUVar4 = pUVar4 + 1) {
    (*(this->super_IResultCapture)._vptr_IResultCapture[4])
              (pUVar4->durationInSeconds,this,pUVar4,&pUVar4->prevAssertions);
  }
  std::
  vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ::clear(&this->m_unfinishedSections);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear(&this->m_messages);
  local_448.m_stream = (ostream *)((this->m_totals).assertions.passed - local_458);
  local_448.m_prevBuf = (streambuf *)((this->m_totals).assertions.failed - sStack_450);
  _missingAssertions = testForMissingAssertions(this,(Counts *)&local_448);
  SectionStats::SectionStats
            ((SectionStats *)&local_250,&local_2b8,(Counts *)&local_448,local_480,_missingAssertions
            );
  pIVar1 = (this->m_reporter).m_p;
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar1,&local_250);
  SectionStats::~SectionStats((SectionStats *)&local_250);
  SectionInfo::~SectionInfo(&local_2b8);
  return;
}

Assistant:

void runCurrentTest( std::string& redirectedCout, std::string& redirectedCerr ) {
            TestCaseInfo const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
            SectionInfo testCaseSection( testCaseInfo.name, testCaseInfo.description, testCaseInfo.lineInfo );
            m_reporter->sectionStarting( testCaseSection );
            Counts prevAssertions = m_totals.assertions;
            double duration = 0;
            try {
                m_lastAssertionInfo = AssertionInfo( "TEST_CASE", testCaseInfo.lineInfo, "", ResultDisposition::Normal );
                TestCaseTracker::Guard guard( *m_testCaseTracker );

                Timer timer;
                timer.start();
                if( m_reporter->getPreferences().shouldRedirectStdOut ) {
                    StreamRedirect coutRedir( std::cout, redirectedCout );
                    StreamRedirect cerrRedir( std::cerr, redirectedCerr );
                    m_activeTestCase->invoke();
                }
                else {
                    m_activeTestCase->invoke();
                }
                duration = timer.getElapsedSeconds();
            }
            catch( TestFailureException& ) {
                // This just means the test was aborted due to failure
            }
            catch(...) {
                ExpressionResultBuilder exResult( ResultWas::ThrewException );
                exResult << translateActiveException();
                actOnCurrentResult( exResult.buildResult( m_lastAssertionInfo )  );
            }
            // If sections ended prematurely due to an exception we stored their
            // infos here so we can tear them down outside the unwind process.
            for( std::vector<UnfinishedSections>::const_iterator it = m_unfinishedSections.begin(),
                        itEnd = m_unfinishedSections.end();
                    it != itEnd;
                    ++it )
                sectionEnded( it->info, it->prevAssertions, it->durationInSeconds );
            m_unfinishedSections.clear();
            m_messages.clear();

            Counts assertions = m_totals.assertions - prevAssertions;
            bool missingAssertions = testForMissingAssertions( assertions );

            SectionStats testCaseSectionStats( testCaseSection, assertions, duration, missingAssertions );
            m_reporter->sectionEnded( testCaseSectionStats );
        }